

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O2

size_t __thiscall
cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::clean_expired_values
          (ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this)

{
  time_point now;
  size_t sVar1;
  
  std::mutex::lock((mutex *)this);
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  sVar1 = do_prune(this,now);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return sVar1;
}

Assistant:

auto clean_expired_values() -> size_t
    {
        std::lock_guard guard{m_lock};
        const auto      now = std::chrono::steady_clock::now();
        return do_prune(now);
    }